

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::setAttribute
          (GLShaderProgram *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *data)

{
  bool bVar1;
  __type _Var2;
  element_type *peVar3;
  invalid_argument *this_00;
  undefined8 in_RDX;
  long in_RDI;
  GLShaderAttribute *a;
  iterator __end2;
  iterator __begin2;
  vector<polyscope::render::backend_openGL3_glfw::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute>_>
  *__range2;
  GLShaderAttribute *in_stack_ffffffffffffff78;
  GLShaderProgram *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string local_58 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  reference in_stack_ffffffffffffffc8;
  __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute>_>_>
  local_28;
  long local_20;
  undefined8 local_18;
  
  local_18 = in_RDX;
  (*glad_glBindVertexArray)(*(GLuint *)(in_RDI + 0x98));
  local_20 = in_RDI + 0x58;
  local_28._M_current =
       (GLShaderAttribute *)
       std::
       vector<polyscope::render::backend_openGL3_glfw::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute>_>
       ::begin(in_stack_ffffffffffffff78);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute>_>
  ::end((vector<polyscope::render::backend_openGL3_glfw::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute>_>
         *)in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+((char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      std::invalid_argument::invalid_argument(this_00,local_58);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    in_stack_ffffffffffffffc8 =
         __gnu_cxx::
         __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute>_>_>
         ::operator*(&local_28);
    _Var2 = std::operator==(in_stack_ffffffffffffffa0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if ((_Var2) && (in_stack_ffffffffffffffc8->location != -1)) break;
    __gnu_cxx::
    __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute>_>_>
    ::operator++(&local_28);
  }
  ensureBufferExists(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  peVar3 = std::
           __shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4ee3da);
  (*(peVar3->super_AttributeBuffer)._vptr_AttributeBuffer[3])(peVar3,local_18);
  return;
}

Assistant:

void GLShaderProgram::setAttribute(std::string name, const std::vector<glm::vec3>& data) {
  glBindVertexArray(vaoHandle); // TODO remove these?

  // pass-through to the buffer
  for (GLShaderAttribute& a : attributes) {
    if (a.name == name && a.location != -1) {
      ensureBufferExists(a);
      a.buff->setData(data);
      return;
    }
  }

  throw std::invalid_argument("Tried to set nonexistent attribute with name " + name);
}